

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MeanVarianceNormalizeLayerParams::MeanVarianceNormalizeLayerParams
          (MeanVarianceNormalizeLayerParams *this,MeanVarianceNormalizeLayerParams *from)

{
  void *pvVar1;
  bool bVar2;
  undefined2 uVar3;
  float fVar4;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__MeanVarianceNormalizeLayerParams_003974f8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  bVar2 = from->normalizevariance_;
  uVar3 = *(undefined2 *)&from->field_0x12;
  fVar4 = from->epsilon_;
  this->acrosschannels_ = from->acrosschannels_;
  this->normalizevariance_ = bVar2;
  *(undefined2 *)&this->field_0x12 = uVar3;
  this->epsilon_ = fVar4;
  return;
}

Assistant:

MeanVarianceNormalizeLayerParams::MeanVarianceNormalizeLayerParams(const MeanVarianceNormalizeLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&acrosschannels_, &from.acrosschannels_,
    reinterpret_cast<char*>(&epsilon_) -
    reinterpret_cast<char*>(&acrosschannels_) + sizeof(epsilon_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MeanVarianceNormalizeLayerParams)
}